

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::FixOptionsForField
          (Generator *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  string_view descriptor_str;
  undefined8 proto_00;
  bool bVar1;
  Descriptor *pDVar2;
  string_view local_e8;
  string local_d8;
  string_view local_b8;
  string local_a8;
  allocator<char> local_81;
  string_view local_80;
  string local_70 [48];
  string local_40 [8];
  string field_name;
  FieldDescriptorProto *proto_local;
  FieldDescriptor *field_local;
  Generator *this_local;
  
  field_name.field_2._8_8_ = proto;
  std::__cxx11::string::string(local_40);
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    pDVar2 = FieldDescriptor::extension_scope(field);
    if (pDVar2 == (Descriptor *)0x0) {
      local_80 = FieldDescriptor::name(field);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (local_70,&local_80,&local_81);
      std::__cxx11::string::operator=(local_40,local_70);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator(&local_81);
    }
    else {
      pDVar2 = FieldDescriptor::extension_scope(field);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_b8,"extensions_by_name");
      FieldReferencingExpression_abi_cxx11_(&local_a8,this,pDVar2,field,local_b8);
      std::__cxx11::string::operator=(local_40,(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
    }
  }
  else {
    pDVar2 = FieldDescriptor::containing_type(field);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_e8,"fields_by_name");
    FieldReferencingExpression_abi_cxx11_(&local_d8,this,pDVar2,field,local_e8);
    std::__cxx11::string::operator=(local_40,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  proto_00 = field_name.field_2._8_8_;
  descriptor_str = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_40);
  PrintDescriptorOptionsFixingCode<google::protobuf::FieldDescriptor>
            (this,field,(Proto *)proto_00,descriptor_str);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void Generator::FixOptionsForField(const FieldDescriptor& field,
                                   const FieldDescriptorProto& proto) const {
  std::string field_name;
  if (field.is_extension()) {
    if (field.extension_scope() == nullptr) {
      // Top level extensions.
      field_name = std::string(field.name());
    } else {
      field_name = FieldReferencingExpression(field.extension_scope(), field,
                                              "extensions_by_name");
    }
  } else {
    field_name = FieldReferencingExpression(field.containing_type(), field,
                                            "fields_by_name");
  }
  PrintDescriptorOptionsFixingCode(field, proto, field_name);
}